

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

bool __thiscall
CLI::App::_parse_arg
          (App *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,Classifier current_type,bool param_3)

{
  Option *pOVar1;
  pointer *pppOVar2;
  pointer *pppAVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  uint32_t uVar5;
  pointer pcVar6;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var7;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var8;
  iterator iVar9;
  pointer psVar10;
  pointer puVar11;
  element_type *peVar12;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *puVar13;
  iterator __position;
  pointer ppVar14;
  pointer ppVar15;
  pointer ppVar16;
  pointer pbVar17;
  bool bVar18;
  type_conflict tVar19;
  bool bVar20;
  int iVar21;
  int iVar22;
  Classifier CVar23;
  iterator __begin1;
  HorribleError *pHVar24;
  long *plVar25;
  pointer puVar26;
  undefined8 *puVar27;
  App *this_00;
  pointer psVar28;
  ArgumentMismatch *pAVar29;
  ulong *puVar30;
  Option *pOVar31;
  uint uVar32;
  pointer pbVar33;
  long lVar34;
  undefined8 uVar35;
  ulong uVar36;
  App *pAVar37;
  int t;
  string nvalue;
  App *sub;
  string arg_name;
  string rest;
  string current;
  string value;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *local_3f8;
  undefined1 local_3e0 [32];
  uint32_t local_3c0;
  Classifier local_3bc;
  undefined1 local_3b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  string local_388;
  string local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  string local_320;
  vector<CLI::Option*,std::allocator<CLI::Option*>> *local_300;
  _Alloc_hider local_2f8;
  long local_2f0;
  undefined2 local_2e8;
  undefined6 uStack_2e6;
  string local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  undefined1 local_2a8 [16];
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  undefined1 local_1e8 [16];
  anon_class_32_1_6b09f7e2_for__M_pred local_1d8;
  string local_1b8;
  string local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  string local_158;
  string local_138;
  anon_class_40_2_a297e68f_for__M_pred local_118;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar33 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  pcVar6 = pbVar33[-1]._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_320,pcVar6,pcVar6 + pbVar33[-1]._M_string_length);
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  local_360._M_string_length = 0;
  local_360.field_2._M_local_buf[0] = '\0';
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  local_2d8._M_string_length = 0;
  local_2d8.field_2._M_local_buf[0] = '\0';
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  local_340._M_string_length = 0;
  local_340.field_2._M_local_buf[0] = '\0';
  if (current_type == SHORT) {
    if ((((local_320._M_string_length < 2) || (*local_320._M_dataplus._M_p != '-')) ||
        (local_320._M_dataplus._M_p[1] == 0x2d)) || ((byte)local_320._M_dataplus._M_p[1] < 0x22)) {
      pHVar24 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"Short parsed but missing! You should not see this","");
      HorribleError::HorribleError(pHVar24,&local_b0);
      __cxa_throw(pHVar24,&HorribleError::typeinfo,Error::~Error);
    }
    ::std::__cxx11::string::substr((ulong)local_3e0,(ulong)&local_320);
    ::std::__cxx11::string::operator=((string *)&local_360,(string *)local_3e0);
    if ((Option *)local_3e0._0_8_ != (Option *)(local_3e0 + 0x10)) {
      operator_delete((void *)local_3e0._0_8_);
    }
    ::std::__cxx11::string::substr((ulong)local_3e0,(ulong)&local_320);
    ::std::__cxx11::string::operator=((string *)&local_340,(string *)local_3e0);
    if ((Option *)local_3e0._0_8_ != (Option *)(local_3e0 + 0x10)) {
      operator_delete((void *)local_3e0._0_8_);
    }
  }
  else if (current_type == WINDOWS_STYLE) {
    bVar18 = detail::split_windows_style(&local_320,&local_360,&local_2d8);
    if (!bVar18) {
      pHVar24 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"windows option parsed but missing! You should not see this",""
                );
      HorribleError::HorribleError(pHVar24,&local_d0);
      __cxa_throw(pHVar24,&HorribleError::typeinfo,Error::~Error);
    }
  }
  else {
    if (current_type != LONG) {
      pHVar24 = (HorribleError *)__cxa_allocate_exception(0x38);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,
                 "parsing got called with invalid option! You should not see this","");
      HorribleError::HorribleError(pHVar24,&local_f0);
      __cxa_throw(pHVar24,&HorribleError::typeinfo,Error::~Error);
    }
    bVar18 = detail::split_long(&local_320,&local_360,&local_2d8);
    if (!bVar18) {
      pHVar24 = (HorribleError *)__cxa_allocate_exception(0x38);
      ::std::operator+(&local_50,"Long parsed but missing (you should not see this):",
                       (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish + -1);
      HorribleError::HorribleError(pHVar24,&local_50);
      __cxa_throw(pHVar24,&HorribleError::typeinfo,Error::~Error);
    }
  }
  _Var7._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  _Var8._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  paVar4 = &local_118.arg_name.field_2;
  local_118.arg_name._M_dataplus._M_p = (pointer)paVar4;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,local_360._M_dataplus._M_p,
             local_360._M_dataplus._M_p + local_360._M_string_length);
  local_118.current_type = current_type;
  local_3f8 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
              ::std::
              find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                        (_Var7,_Var8,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.arg_name._M_dataplus._M_p != paVar4) {
    operator_delete(local_118.arg_name._M_dataplus._M_p);
  }
  if (local_3f8 ==
      (this->options_).
      super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    psVar10 = (this->subcommands_).
              super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar28 = (this->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar28 != psVar10;
        psVar28 = psVar28 + 1) {
      pAVar37 = (psVar28->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((((pAVar37->name_)._M_string_length == 0) && (pAVar37->disabled_ == false)) &&
         (bVar18 = _parse_arg(pAVar37,args,current_type,param_3), bVar18)) {
        peVar12 = (psVar28->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        bVar18 = true;
        if (peVar12->pre_parse_called_ == false) {
          pbVar33 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pbVar17 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          peVar12->pre_parse_called_ = true;
          if ((peVar12->pre_parse_callback_).super__Function_base._M_manager != (_Manager_type)0x0)
          {
            local_3e0._0_8_ = (long)pbVar17 - (long)pbVar33 >> 5;
            (*(peVar12->pre_parse_callback_)._M_invoker)
                      ((_Any_data *)&peVar12->pre_parse_callback_,(unsigned_long *)local_3e0);
          }
        }
        goto LAB_00133cd0;
      }
    }
    if (((current_type == SHORT) && (this->allow_non_standard_options_ != false)) &&
       (2 < local_320._M_string_length)) {
      local_3e0._0_8_ = local_3e0 + 0x10;
      local_3e0._8_8_ = 0;
      local_3e0[0x10] = '\0';
      local_3b8._8_8_ = (pointer)0x0;
      local_3b8._16_8_ = local_3b8._16_8_ & 0xffffffffffffff00;
      local_2e8 = 0x2d;
      local_2f0 = 1;
      local_3b8._0_8_ = (Option *)(local_3b8 + 0x10);
      local_2f8._M_p = (pointer)&local_2e8;
      plVar25 = (long *)::std::__cxx11::string::_M_append
                                  ((char *)&local_2f8,(ulong)local_320._M_dataplus._M_p);
      puVar30 = (ulong *)(plVar25 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar25 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar30) {
        local_388.field_2._M_allocated_capacity = *puVar30;
        local_388.field_2._8_8_ = plVar25[3];
        local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
      }
      else {
        local_388.field_2._M_allocated_capacity = *puVar30;
        local_388._M_dataplus._M_p = (pointer)*plVar25;
      }
      local_388._M_string_length = plVar25[1];
      *plVar25 = (long)puVar30;
      plVar25[1] = 0;
      *(undefined1 *)(plVar25 + 2) = 0;
      detail::split_long(&local_388,(string *)local_3e0,(string *)local_3b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p);
      }
      if (local_2f8._M_p != (pointer)&local_2e8) {
        operator_delete(local_2f8._M_p);
      }
      _Var7._M_current =
           (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      _Var8._M_current =
           (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      paVar4 = &local_1d8.narg_name.field_2;
      local_1d8.narg_name._M_dataplus._M_p = (pointer)paVar4;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)(local_1e8 + 0x10),local_3e0._0_8_,
                 (pointer)(local_3e0._0_8_ + local_3e0._8_8_));
      local_3f8 = (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
                  ::std::
                  find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_arg(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,CLI::detail::Classifier,bool)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_2_>
                            (_Var7,_Var8,(anon_class_32_1_6b09f7e2_for__M_pred *)(local_1e8 + 0x10))
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.narg_name._M_dataplus._M_p != paVar4) {
        operator_delete(local_1d8.narg_name._M_dataplus._M_p);
      }
      puVar13 = (this->options_).
                super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (local_3f8 != puVar13) {
        ::std::__cxx11::string::_M_assign((string *)&local_360);
        ::std::__cxx11::string::_M_assign((string *)&local_2d8);
        local_340._M_string_length = 0;
        *local_340._M_dataplus._M_p = '\0';
      }
      if ((Option *)local_3b8._0_8_ != (Option *)(local_3b8 + 0x10)) {
        operator_delete((void *)local_3b8._0_8_);
      }
      if ((Option *)local_3e0._0_8_ != (Option *)(local_3e0 + 0x10)) {
        operator_delete((void *)local_3e0._0_8_);
      }
      if (local_3f8 != puVar13) goto LAB_00132b43;
    }
    if ((this->parent_ == (App *)0x0) || ((this->name_)._M_string_length != 0)) {
      lVar34 = ::std::__cxx11::string::find((char)&local_360,0x2e);
      if (lVar34 != -1) {
        ::std::__cxx11::string::substr((ulong)local_3e0,(ulong)&local_360);
        local_398._M_allocated_capacity =
             (size_type)_find_subcommand(this,(string *)local_3e0,true,false);
        if ((Option *)local_3e0._0_8_ != (Option *)(local_3e0 + 0x10)) {
          operator_delete((void *)local_3e0._0_8_);
        }
        if ((App *)local_398._M_allocated_capacity != (App *)0x0) {
          pbVar33 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          pcVar6 = pbVar33[-1]._M_dataplus._M_p;
          local_3e0._0_8_ = (Option *)(local_3e0 + 0x10);
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3e0,pcVar6,pcVar6 + pbVar33[-1]._M_string_length);
          pbVar33 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = pbVar33 + -1;
          pcVar6 = pbVar33[-1]._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar6 != &pbVar33[-1].field_2) {
            operator_delete(pcVar6);
          }
          ::std::__cxx11::string::substr((ulong)local_3b8,(ulong)&local_360);
          ::std::__cxx11::string::operator=((string *)&local_360,(string *)local_3b8);
          pOVar31 = (Option *)(local_3b8 + 0x10);
          if ((Option *)local_3b8._0_8_ != pOVar31) {
            operator_delete((void *)local_3b8._0_8_);
          }
          if (local_360._M_string_length < 2) {
            ::std::__cxx11::string::substr((ulong)local_3b8,(ulong)local_3e0);
            *(char *)local_3b8._0_8_ = '-';
            if ((pointer)0x2 < (ulong)local_3b8._8_8_) {
              ::std::__cxx11::string::substr((ulong)&local_388,(ulong)local_3b8);
              ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,
                         &local_388);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_388._M_dataplus._M_p != &local_388.field_2) {
                operator_delete(local_388._M_dataplus._M_p);
              }
              ::std::__cxx11::string::resize((ulong)local_3b8,'\x02');
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(args,(value_type *)local_3b8);
            if ((Option *)local_3b8._0_8_ != pOVar31) {
              operator_delete((void *)local_3b8._0_8_);
            }
            current_type = SHORT;
          }
          else {
            paVar4 = &local_388.field_2;
            local_388._M_dataplus._M_p = (pointer)paVar4;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"--","");
            ::std::__cxx11::string::substr((ulong)&local_2f8,(ulong)local_3e0);
            uVar35 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_388._M_dataplus._M_p != paVar4) {
              uVar35 = local_388.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar35 < local_388._M_string_length + local_2f0) {
              uVar36 = 0xf;
              if (local_2f8._M_p != (pointer)&local_2e8) {
                uVar36 = CONCAT62(uStack_2e6,local_2e8);
              }
              if (uVar36 < local_388._M_string_length + local_2f0) goto LAB_0013395d;
              puVar27 = (undefined8 *)
                        ::std::__cxx11::string::replace
                                  ((ulong)&local_2f8,0,(char *)0x0,(ulong)local_388._M_dataplus._M_p
                                  );
            }
            else {
LAB_0013395d:
              puVar27 = (undefined8 *)
                        ::std::__cxx11::string::_M_append((char *)&local_388,(ulong)local_2f8._M_p);
            }
            pOVar1 = (Option *)(puVar27 + 2);
            if ((Option *)*puVar27 == pOVar1) {
              local_3b8._16_8_ = (pOVar1->super_OptionBase<CLI::Option>).group_._M_dataplus._M_p;
              local_3b8._24_8_ = puVar27[3];
              local_3b8._0_8_ = pOVar31;
            }
            else {
              local_3b8._16_8_ = (pOVar1->super_OptionBase<CLI::Option>).group_._M_dataplus._M_p;
              local_3b8._0_8_ = (Option *)*puVar27;
            }
            local_3b8._8_8_ = puVar27[1];
            *puVar27 = pOVar1;
            puVar27[1] = 0;
            *(undefined1 *)&(pOVar1->super_OptionBase<CLI::Option>).group_._M_dataplus._M_p = 0;
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)args,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3b8);
            if ((Option *)local_3b8._0_8_ != pOVar31) {
              operator_delete((void *)local_3b8._0_8_);
            }
            if (local_2f8._M_p != (pointer)&local_2e8) {
              operator_delete(local_2f8._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_388._M_dataplus._M_p != paVar4) {
              operator_delete(local_388._M_dataplus._M_p);
            }
            current_type = LONG;
          }
          bVar20 = _parse_arg((App *)local_398._M_allocated_capacity,args,current_type,true);
          if (bVar20) {
            if (*(bool *)(local_398._M_allocated_capacity + 0x2e2) == false) {
              __position._M_current =
                   (this->parsed_subcommands_).
                   super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current ==
                  (this->parsed_subcommands_).
                  super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                ::std::vector<CLI::App*,std::allocator<CLI::App*>>::
                _M_realloc_insert<CLI::App*const&>
                          ((vector<CLI::App*,std::allocator<CLI::App*>> *)&this->parsed_subcommands_
                           ,__position,(App **)&local_398._M_allocated_capacity);
              }
              else {
                *__position._M_current = (App *)local_398._M_allocated_capacity;
                pppAVar3 = &(this->parsed_subcommands_).
                            super__Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                *pppAVar3 = *pppAVar3 + 1;
              }
            }
            increment_parsed(this);
            if (this->pre_parse_called_ == false) {
              pbVar33 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
              pbVar17 = (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              this->pre_parse_called_ = true;
              if ((this->pre_parse_callback_).super__Function_base._M_manager != (_Manager_type)0x0)
              {
                local_3b8._0_8_ = (long)pbVar33 - (long)pbVar17 >> 5;
                (*(this->pre_parse_callback_)._M_invoker)
                          ((_Any_data *)&this->pre_parse_callback_,(unsigned_long *)local_3b8);
              }
            }
            else if ((this->immediate_callback_ == true) && ((this->name_)._M_string_length != 0)) {
              local_3c0 = this->parsed_;
              ppVar14 = (this->missing_).
                        super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              ppVar15 = (this->missing_).
                        super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              ppVar16 = (this->missing_).
                        super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
              (this->missing_).
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (this->missing_).
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (this->missing_).
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_388._M_dataplus._M_p = (pointer)ppVar14;
              local_388._M_string_length = (size_type)ppVar15;
              local_388.field_2._M_allocated_capacity = (size_type)ppVar16;
              clear(this);
              this->parsed_ = local_3c0;
              this->pre_parse_called_ = true;
              local_3b8._16_8_ =
                   (this->missing_).
                   super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              (this->missing_).
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar16;
              local_3b8._0_8_ =
                   (this->missing_).
                   super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_3b8._8_8_ =
                   (this->missing_).
                   super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              (this->missing_).
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = ppVar14;
              (this->missing_).
              super__Vector_base<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = ppVar15;
              local_388._M_dataplus._M_p = (pointer)0x0;
              local_388._M_string_length = 0;
              local_388.field_2._M_allocated_capacity = 0;
              std::
              vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector((vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_3b8);
              std::
              vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector((vector<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<CLI::detail::Classifier,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_388);
            }
            if (*(_Manager_type *)(local_398._M_allocated_capacity + 0x80) != (_Manager_type)0x0) {
              _process_env((App *)local_398._M_allocated_capacity);
              _process_callbacks((App *)local_398._M_allocated_capacity);
              _process_help_flags((App *)local_398._M_allocated_capacity,false,false);
              _process_requirements((App *)local_398._M_allocated_capacity);
              run_callback((App *)local_398._M_allocated_capacity,false,true);
            }
          }
          else {
            pbVar33 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish = pbVar33 + -1;
            pcVar6 = pbVar33[-1]._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar6 != &pbVar33[-1].field_2) {
              operator_delete(pcVar6);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(args,(value_type *)local_3e0);
          }
          if ((Option *)local_3e0._0_8_ != (Option *)(local_3e0 + 0x10)) {
            operator_delete((void *)local_3e0._0_8_);
          }
          bVar18 = true;
          if (bVar20) goto LAB_00133cd0;
        }
      }
      if (!param_3) {
        if ((this->parent_ == (App *)0x0) || (pAVar37 = this->parent_, this->fallthrough_ != true))
        {
          pbVar33 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = pbVar33 + -1;
          pcVar6 = pbVar33[-1]._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar6 != &pbVar33[-1].field_2) {
            operator_delete(pcVar6);
          }
          local_3e0._0_4_ = current_type;
          pAVar37 = this;
          if (this->allow_extras_ == false) {
            psVar28 = (this->subcommands_).
                      super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            while ((pAVar37 = this,
                   psVar28 !=
                   (this->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish &&
                   ((pAVar37 = (psVar28->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr, (pAVar37->name_)._M_string_length != 0 ||
                    (pAVar37->allow_extras_ == false))))) {
              psVar28 = psVar28 + 1;
            }
          }
          ::std::
          vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
          ::emplace_back<CLI::detail::Classifier&,std::__cxx11::string_const&>
                    ((vector<std::pair<CLI::detail::Classifier,std::__cxx11::string>,std::allocator<std::pair<CLI::detail::Classifier,std::__cxx11::string>>>
                      *)&pAVar37->missing_,(Classifier *)local_3e0,&local_320);
          bVar18 = true;
        }
        else {
          do {
            this_00 = pAVar37;
            if (this_00->parent_ == (App *)0x0) break;
            pAVar37 = this_00->parent_;
          } while ((this_00->name_)._M_string_length == 0);
          bVar18 = _parse_arg(this_00,args,current_type,false);
        }
        goto LAB_00133cd0;
      }
    }
    bVar18 = false;
    goto LAB_00133cd0;
  }
LAB_00132b43:
  pbVar33 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  (args->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = pbVar33 + -1;
  pcVar6 = pbVar33[-1]._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar6 != &pbVar33[-1].field_2) {
    operator_delete(pcVar6);
  }
  pOVar31 = (local_3f8->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
            _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
            super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  if (((pOVar31->inject_separator_ == true) &&
      (pbVar33 = (pOVar31->results_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
      (pOVar31->results_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != pbVar33)) && (pbVar33[-1]._M_string_length != 0))
  {
    local_138._M_string_length = 0;
    local_138.field_2._M_local_buf[0] = '\0';
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    Option::_add_result(pOVar31,&local_138,&pOVar31->results_);
    pOVar31->current_option_state_ = parsing;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
  }
  pOVar31 = (local_3f8->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
            _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
            super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  if ((pOVar31->trigger_on_result_ == true) && (pOVar31->current_option_state_ == callback_run)) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&pOVar31->results_);
    pOVar31->current_option_state_ = parsing;
    pOVar31 = (local_3f8->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  }
  uVar5 = pOVar31->type_size_min_;
  local_3c0 = pOVar31->expected_min_ * uVar5;
  if ((int)uVar5 <= (int)local_3c0) {
    local_3c0 = uVar5;
  }
  local_3e0._0_4_ = pOVar31->type_size_max_;
  tVar19 = detail::checked_multiply<int>((int *)local_3e0,pOVar31->expected_max_);
  local_3bc = 0x20000000;
  if (tVar19) {
    local_3bc = local_3e0._0_4_;
  }
  if ((int)local_3bc < 0x2000000) {
LAB_00132c86:
    local_3bc = local_3e0._0_4_;
    if (local_3e0._0_4_ != NONE) goto LAB_00132c92;
    pOVar31 = (local_3f8->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    local_1f8._M_allocated_capacity = (size_type)local_1e8;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,local_2d8._M_dataplus._M_p,
               local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
    Option::get_flag_value((string *)local_3e0,pOVar31,&local_360,(string *)&local_1f8);
    if ((undefined1 *)local_1f8._M_allocated_capacity != local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity);
    }
    pOVar31 = (local_3f8->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_218,local_3e0._0_8_,(pointer)(local_3e0._0_8_ + local_3e0._8_8_));
    Option::_add_result(pOVar31,&local_218,&pOVar31->results_);
    pOVar31->current_option_state_ = parsing;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    local_3b8._0_8_ =
         (local_3f8->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
         _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    iVar9._M_current =
         (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar9._M_current ==
        (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,iVar9,
                 (Option **)local_3b8);
    }
    else {
      *iVar9._M_current = (Option *)local_3b8._0_8_;
      pppOVar2 = &(this->parse_order_).
                  super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppOVar2 = *pppOVar2 + 1;
    }
    if ((Option *)local_3e0._0_8_ != (Option *)(local_3e0 + 0x10)) {
      operator_delete((void *)local_3e0._0_8_);
    }
    local_3bc = NONE;
LAB_00133005:
    iVar21 = 0;
  }
  else {
    pOVar31 = (local_3f8->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if (pOVar31->allow_extra_args_ == false) {
      local_3e0._0_4_ = pOVar31->type_size_max_;
      tVar19 = detail::checked_multiply<int>((int *)local_3e0,pOVar31->expected_min_);
      local_3bc = 0x20000000;
      if (tVar19) {
        goto LAB_00132c86;
      }
    }
LAB_00132c92:
    if (local_2d8._M_string_length == 0) {
      if ((char *)local_340._M_string_length == (char *)0x0) goto LAB_00133005;
      pOVar31 = (local_3f8->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,local_340._M_dataplus._M_p,
                 local_340._M_dataplus._M_p + local_340._M_string_length);
      iVar21 = Option::_add_result(pOVar31,&local_258,&pOVar31->results_);
      pOVar31->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p);
      }
      local_3e0._0_8_ =
           (local_3f8->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
           _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      iVar9._M_current =
           (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                  ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,iVar9,
                   (Option **)local_3e0);
      }
      else {
        *iVar9._M_current = (Option *)local_3e0._0_8_;
        pppOVar2 = &(this->parse_order_).
                    super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppOVar2 = *pppOVar2 + 1;
      }
      ::std::__cxx11::string::_M_replace
                ((ulong)&local_340,0,(char *)local_340._M_string_length,0x1479ca);
    }
    else {
      pOVar31 = (local_3f8->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,local_2d8._M_dataplus._M_p,
                 local_2d8._M_dataplus._M_p + local_2d8._M_string_length);
      iVar21 = Option::_add_result(pOVar31,&local_238,&pOVar31->results_);
      pOVar31->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      local_3e0._0_8_ =
           (local_3f8->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
           _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      iVar9._M_current =
           (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                  ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_,iVar9,
                   (Option **)local_3e0);
      }
      else {
        *iVar9._M_current = (Option *)local_3e0._0_8_;
        pppOVar2 = &(this->parse_order_).
                    super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppOVar2 = *pppOVar2 + 1;
      }
    }
  }
  if (iVar21 < (int)local_3c0) {
    local_398._8_8_ = &this->parse_order_;
    do {
      pbVar33 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if ((args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start == pbVar33) {
        pAVar29 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        Option::get_name_abi_cxx11_
                  (&local_158,
                   (local_3f8->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,false,false);
        Option::get_type_name_abi_cxx11_
                  (&local_70,
                   (local_3f8->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
        ArgumentMismatch::TypedAtLeast(pAVar29,&local_158,local_3c0,&local_70);
        __cxa_throw(pAVar29,&ArgumentMismatch::typeinfo,Error::~Error);
      }
      pcVar6 = pbVar33[-1]._M_dataplus._M_p;
      local_3e0._0_8_ = (Option *)(local_3e0 + 0x10);
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_3e0,pcVar6,pcVar6 + pbVar33[-1]._M_string_length);
      pbVar33 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = pbVar33 + -1;
      pcVar6 = pbVar33[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar6 != &pbVar33[-1].field_2) {
        operator_delete(pcVar6);
      }
      pOVar31 = (local_3f8->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_278,local_3e0._0_8_,(pointer)(local_3e0._0_8_ + local_3e0._8_8_));
      iVar22 = Option::_add_result(pOVar31,&local_278,&pOVar31->results_);
      pOVar31->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p);
      }
      local_3b8._0_8_ =
           (local_3f8->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
           _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      iVar9._M_current =
           (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                  ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)local_398._8_8_,iVar9,
                   (Option **)local_3b8);
      }
      else {
        *iVar9._M_current = (Option *)local_3b8._0_8_;
        pppOVar2 = &(this->parse_order_).
                    super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppOVar2 = *pppOVar2 + 1;
      }
      if ((Option *)local_3e0._0_8_ != (Option *)(local_3e0 + 0x10)) {
        operator_delete((void *)local_3e0._0_8_);
      }
      iVar21 = iVar21 + iVar22;
    } while (iVar21 < (int)local_3c0);
  }
  if ((iVar21 < (int)local_3bc) ||
     (((local_3f8->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
       super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
       super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->allow_extra_args_ == true)) {
    puVar26 = (this->options_).
              super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar11 = (this->options_).
              super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar26 == puVar11) {
      local_398._8_8_ = (vector<CLI::Option*,std::allocator<CLI::Option*>> *)0x0;
    }
    else {
      local_398._8_8_ = (vector<CLI::Option*,std::allocator<CLI::Option*>> *)0x0;
      do {
        pOVar31 = (puVar26->_M_t).
                  super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                  super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                  super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        if (((((pOVar31->pname_)._M_string_length != 0) &&
             ((pOVar31->super_OptionBase<CLI::Option>).required_ == true)) &&
            (uVar32 = pOVar31->expected_min_ * pOVar31->type_size_min_, 0 < (int)uVar32)) &&
           (lVar34 = (long)(pOVar31->results_).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     *(long *)&(pOVar31->results_).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl >> 5, (int)lVar34 < (int)uVar32)) {
          local_398._8_8_ =
               (vector<CLI::Option*,std::allocator<CLI::Option*>> *)
               (local_398._8_8_ + (ulong)uVar32) + -lVar34;
        }
        puVar26 = puVar26 + 1;
      } while (puVar26 != puVar11);
    }
    local_300 = (vector<CLI::Option*,std::allocator<CLI::Option*>> *)&this->parse_order_;
    do {
      if (iVar21 < (int)local_3bc) {
        pbVar33 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        pbVar33 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        if (((local_3f8->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
             ._M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->allow_extra_args_ != true)
        goto LAB_001333de;
      }
      if ((args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start == pbVar33) goto LAB_001333de;
      CVar23 = _recognize(this,pbVar33 + -1,false);
      pbVar33 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if ((CVar23 != NONE) ||
         ((vector<CLI::Option*,std::allocator<CLI::Option*>> *)
          ((long)pbVar33 -
           (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 5) <= (ulong)local_398._8_8_))
      goto LAB_001333de;
      if (this->validate_optional_arguments_ == true) {
        local_3e0._0_8_ = local_3e0 + 0x10;
        pcVar6 = pbVar33[-1]._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_3e0,pcVar6,pcVar6 + pbVar33[-1]._M_string_length);
        Option::_validate((string *)local_3b8,
                          (local_3f8->_M_t).
                          super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t
                          .super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                          super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,
                          (string *)local_3e0,0);
        ::std::__cxx11::string::operator=((string *)local_3e0,(string *)local_3b8);
        if ((Option *)local_3b8._0_8_ != (Option *)(local_3b8 + 0x10)) {
          operator_delete((void *)local_3b8._0_8_);
        }
        uVar35 = local_3e0._8_8_;
        if ((Option *)local_3e0._0_8_ != (Option *)(local_3e0 + 0x10)) {
          operator_delete((void *)local_3e0._0_8_);
        }
        pbVar33 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        if (uVar35 != 0) goto LAB_001333de;
      }
      pOVar31 = (local_3f8->_M_t).
                super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      local_2b8._M_allocated_capacity = (size_type)local_2a8;
      pcVar6 = pbVar33[-1]._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b8,pcVar6,pcVar6 + pbVar33[-1]._M_string_length);
      iVar22 = Option::_add_result(pOVar31,(string *)&local_2b8,&pOVar31->results_);
      pOVar31->current_option_state_ = parsing;
      if ((undefined1 *)local_2b8._M_allocated_capacity != local_2a8) {
        operator_delete((void *)local_2b8._M_allocated_capacity);
      }
      local_3e0._0_8_ =
           (local_3f8->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
           _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
           super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
      iVar9._M_current =
           (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar9._M_current ==
          (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                  (local_300,iVar9,(Option **)local_3e0);
      }
      else {
        *iVar9._M_current = (Option *)local_3e0._0_8_;
        pppOVar2 = &(this->parse_order_).
                    super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppOVar2 = *pppOVar2 + 1;
      }
      pbVar33 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = pbVar33 + -1;
      pcVar6 = pbVar33[-1]._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar6 != &pbVar33[-1].field_2) {
        operator_delete(pcVar6);
      }
      iVar21 = iVar21 + iVar22;
    } while( true );
  }
LAB_0013352e:
  if (0 < (int)local_3c0) {
    pOVar31 = (local_3f8->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if (iVar21 % pOVar31->type_size_max_ != 0) {
      if (pOVar31->type_size_max_ == pOVar31->type_size_min_) {
        pAVar29 = (ArgumentMismatch *)__cxa_allocate_exception(0x38);
        Option::get_name_abi_cxx11_
                  (&local_1b8,
                   (local_3f8->_M_t).
                   super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                   super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                   super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,false,false);
        pOVar31 = (local_3f8->_M_t).
                  super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                  super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                  super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
        iVar21 = pOVar31->type_size_min_;
        Option::get_type_name_abi_cxx11_(&local_90,pOVar31);
        ArgumentMismatch::PartialType(pAVar29,&local_1b8,iVar21,&local_90);
        __cxa_throw(pAVar29,&ArgumentMismatch::typeinfo,Error::~Error);
      }
      local_198._M_string_length = 0;
      local_198.field_2._M_local_buf[0] = '\0';
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      Option::_add_result(pOVar31,&local_198,&pOVar31->results_);
      pOVar31->current_option_state_ = parsing;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p);
      }
    }
  }
  pOVar31 = (local_3f8->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
            _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
            super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
  if (pOVar31->trigger_on_result_ == true) {
    Option::run_callback(pOVar31);
  }
  bVar18 = true;
  if ((char *)local_340._M_string_length != (char *)0x0) {
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0,
                     "-",&local_340);
    ::std::__cxx11::string::operator=((string *)&local_340,(string *)local_3e0);
    if ((Option *)local_3e0._0_8_ != (Option *)(local_3e0 + 0x10)) {
      operator_delete((void *)local_3e0._0_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(args,&local_340);
  }
LAB_00133cd0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p);
  }
  return bVar18;
LAB_001333de:
  if (((args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start != pbVar33) &&
     (CVar23 = _recognize(this,pbVar33 + -1,true), CVar23 == POSITIONAL_MARK)) {
    pbVar33 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    (args->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = pbVar33 + -1;
    pcVar6 = pbVar33[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar6 != &pbVar33[-1].field_2) {
      operator_delete(pcVar6);
    }
  }
  if ((0 < (int)local_3bc) && (iVar21 == 0 && local_3c0 == 0)) {
    local_178._8_8_ = 0;
    local_168._M_local_buf[0] = '\0';
    local_178._M_allocated_capacity = (size_type)&local_168;
    Option::get_flag_value
              ((string *)local_3e0,
               (local_3f8->_M_t).
               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,&local_360,
               (string *)&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_allocated_capacity != &local_168) {
      operator_delete((void *)local_178._M_allocated_capacity);
    }
    pOVar31 = (local_3f8->_M_t).
              super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
              super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
              super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_298,local_3e0._0_8_,(pointer)(local_3e0._0_8_ + local_3e0._8_8_));
    Option::_add_result(pOVar31,&local_298,&pOVar31->results_);
    pOVar31->current_option_state_ = parsing;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p);
    }
    local_3b8._0_8_ =
         (local_3f8->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
         _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    iVar9._M_current =
         (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar9._M_current ==
        (this->parse_order_).super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<CLI::Option*,std::allocator<CLI::Option*>>::_M_realloc_insert<CLI::Option*>
                (local_300,iVar9,(Option **)local_3b8);
    }
    else {
      *iVar9._M_current = (Option *)local_3b8._0_8_;
      pppOVar2 = &(this->parse_order_).
                  super__Vector_base<CLI::Option_*,_std::allocator<CLI::Option_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppOVar2 = *pppOVar2 + 1;
    }
    if ((Option *)local_3e0._0_8_ != (Option *)(local_3e0 + 0x10)) {
      operator_delete((void *)local_3e0._0_8_);
    }
  }
  goto LAB_0013352e;
}

Assistant:

CLI11_INLINE bool
App::_parse_arg(std::vector<std::string> &args, detail::Classifier current_type, bool local_processing_only) {

    std::string current = args.back();

    std::string arg_name;
    std::string value;
    std::string rest;

    switch(current_type) {
    case detail::Classifier::LONG:
        if(!detail::split_long(current, arg_name, value))
            throw HorribleError("Long parsed but missing (you should not see this):" + args.back());
        break;
    case detail::Classifier::SHORT:
        if(!detail::split_short(current, arg_name, rest))
            throw HorribleError("Short parsed but missing! You should not see this");
        break;
    case detail::Classifier::WINDOWS_STYLE:
        if(!detail::split_windows_style(current, arg_name, value))
            throw HorribleError("windows option parsed but missing! You should not see this");
        break;
    case detail::Classifier::SUBCOMMAND:
    case detail::Classifier::SUBCOMMAND_TERMINATOR:
    case detail::Classifier::POSITIONAL_MARK:
    case detail::Classifier::NONE:
    default:
        throw HorribleError("parsing got called with invalid option! You should not see this");
    }

    auto op_ptr = std::find_if(std::begin(options_), std::end(options_), [arg_name, current_type](const Option_p &opt) {
        if(current_type == detail::Classifier::LONG)
            return opt->check_lname(arg_name);
        if(current_type == detail::Classifier::SHORT)
            return opt->check_sname(arg_name);
        // this will only get called for detail::Classifier::WINDOWS_STYLE
        return opt->check_lname(arg_name) || opt->check_sname(arg_name);
    });

    // Option not found
    while(op_ptr == std::end(options_)) {
        // using while so we can break
        for(auto &subc : subcommands_) {
            if(subc->name_.empty() && !subc->disabled_) {
                if(subc->_parse_arg(args, current_type, local_processing_only)) {
                    if(!subc->pre_parse_called_) {
                        subc->_trigger_pre_parse(args.size());
                    }
                    return true;
                }
            }
        }
        if(allow_non_standard_options_ && current_type == detail::Classifier::SHORT && current.size() > 2) {
            std::string narg_name;
            std::string nvalue;
            detail::split_long(std::string{'-'} + current, narg_name, nvalue);
            op_ptr = std::find_if(std::begin(options_), std::end(options_), [narg_name](const Option_p &opt) {
                return opt->check_sname(narg_name);
            });
            if(op_ptr != std::end(options_)) {
                arg_name = narg_name;
                value = nvalue;
                rest.clear();
                break;
            }
        }

        // don't capture missing if this is a nameless subcommand and nameless subcommands can't fallthrough
        if(parent_ != nullptr && name_.empty()) {
            return false;
        }

        // now check for '.' notation of subcommands
        auto dotloc = arg_name.find_first_of('.', 1);
        if(dotloc != std::string::npos) {
            // using dot notation is equivalent to single argument subcommand
            auto *sub = _find_subcommand(arg_name.substr(0, dotloc), true, false);
            if(sub != nullptr) {
                std::string v = args.back();
                args.pop_back();
                arg_name = arg_name.substr(dotloc + 1);
                if(arg_name.size() > 1) {
                    args.push_back(std::string("--") + v.substr(dotloc + 3));
                    current_type = detail::Classifier::LONG;
                } else {
                    auto nval = v.substr(dotloc + 2);
                    nval.front() = '-';
                    if(nval.size() > 2) {
                        // '=' not allowed in short form arguments
                        args.push_back(nval.substr(3));
                        nval.resize(2);
                    }
                    args.push_back(nval);
                    current_type = detail::Classifier::SHORT;
                }
                auto val = sub->_parse_arg(args, current_type, true);
                if(val) {
                    if(!sub->silent_) {
                        parsed_subcommands_.push_back(sub);
                    }
                    // deal with preparsing
                    increment_parsed();
                    _trigger_pre_parse(args.size());
                    // run the parse complete callback since the subcommand processing is now complete
                    if(sub->parse_complete_callback_) {
                        sub->_process_env();
                        sub->_process_callbacks();
                        sub->_process_help_flags();
                        sub->_process_requirements();
                        sub->run_callback(false, true);
                    }
                    return true;
                }
                args.pop_back();
                args.push_back(v);
            }
        }
        if(local_processing_only) {
            return false;
        }
        // If a subcommand, try the main command
        if(parent_ != nullptr && fallthrough_)
            return _get_fallthrough_parent()->_parse_arg(args, current_type, false);

        // Otherwise, add to missing
        args.pop_back();
        _move_to_missing(current_type, current);
        return true;
    }

    args.pop_back();

    // Get a reference to the pointer to make syntax bearable
    Option_p &op = *op_ptr;
    /// if we require a separator add it here
    if(op->get_inject_separator()) {
        if(!op->results().empty() && !op->results().back().empty()) {
            op->add_result(std::string{});
        }
    }
    if(op->get_trigger_on_parse() && op->current_option_state_ == Option::option_state::callback_run) {
        op->clear();
    }
    int min_num = (std::min)(op->get_type_size_min(), op->get_items_expected_min());
    int max_num = op->get_items_expected_max();
    // check container like options to limit the argument size to a single type if the allow_extra_flags argument is
    // set. 16 is somewhat arbitrary (needs to be at least 4)
    if(max_num >= detail::expected_max_vector_size / 16 && !op->get_allow_extra_args()) {
        auto tmax = op->get_type_size_max();
        max_num = detail::checked_multiply(tmax, op->get_expected_min()) ? tmax : detail::expected_max_vector_size;
    }
    // Make sure we always eat the minimum for unlimited vectors
    int collected = 0;     // total number of arguments collected
    int result_count = 0;  // local variable for number of results in a single arg string
    // deal with purely flag like things
    if(max_num == 0) {
        auto res = op->get_flag_value(arg_name, value);
        op->add_result(res);
        parse_order_.push_back(op.get());
    } else if(!value.empty()) {  // --this=value
        op->add_result(value, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
        // -Trest
    } else if(!rest.empty()) {
        op->add_result(rest, result_count);
        parse_order_.push_back(op.get());
        rest = "";
        collected += result_count;
    }

    // gather the minimum number of arguments
    while(min_num > collected && !args.empty()) {
        std::string current_ = args.back();
        args.pop_back();
        op->add_result(current_, result_count);
        parse_order_.push_back(op.get());
        collected += result_count;
    }

    if(min_num > collected) {  // if we have run out of arguments and the minimum was not met
        throw ArgumentMismatch::TypedAtLeast(op->get_name(), min_num, op->get_type_name());
    }

    // now check for optional arguments
    if(max_num > collected || op->get_allow_extra_args()) {  // we allow optional arguments
        auto remreqpos = _count_remaining_positionals(true);
        // we have met the minimum now optionally check up to the maximum
        while((collected < max_num || op->get_allow_extra_args()) && !args.empty() &&
              _recognize(args.back(), false) == detail::Classifier::NONE) {
            // If any required positionals remain, don't keep eating
            if(remreqpos >= args.size()) {
                break;
            }
            if(validate_optional_arguments_) {
                std::string arg = args.back();
                arg = op->_validate(arg, 0);
                if(!arg.empty()) {
                    break;
                }
            }
            op->add_result(args.back(), result_count);
            parse_order_.push_back(op.get());
            args.pop_back();
            collected += result_count;
        }

        // Allow -- to end an unlimited list and "eat" it
        if(!args.empty() && _recognize(args.back()) == detail::Classifier::POSITIONAL_MARK)
            args.pop_back();
        // optional flag that didn't receive anything now get the default value
        if(min_num == 0 && max_num > 0 && collected == 0) {
            auto res = op->get_flag_value(arg_name, std::string{});
            op->add_result(res);
            parse_order_.push_back(op.get());
        }
    }
    // if we only partially completed a type then add an empty string if allowed for later processing
    if(min_num > 0 && (collected % op->get_type_size_max()) != 0) {
        if(op->get_type_size_max() != op->get_type_size_min()) {
            op->add_result(std::string{});
        } else {
            throw ArgumentMismatch::PartialType(op->get_name(), op->get_type_size_min(), op->get_type_name());
        }
    }
    if(op->get_trigger_on_parse()) {
        op->run_callback();
    }
    if(!rest.empty()) {
        rest = "-" + rest;
        args.push_back(rest);
    }
    return true;
}